

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseImport(Parser *this,ImportRule *importRule)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Symbol *pSVar10;
  Symbol *pSVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (this->symbols).d.size;
  iVar6 = this->index;
  lVar9 = (long)iVar6;
  if (lVar9 < lVar7) {
    pSVar10 = (this->symbols).d.ptr;
    if (pSVar10[lVar9].token == S) {
      pSVar10 = pSVar10 + lVar9;
      lVar12 = -1;
      do {
        lVar13 = lVar12;
        pSVar10 = pSVar10 + 1;
        if (lVar9 - lVar7 == lVar13) break;
        lVar12 = lVar13 + -1;
      } while (pSVar10->token == S);
      this->index = iVar6 - (int)lVar13;
      iVar6 = iVar6 - (int)lVar13;
    }
    lVar9 = (long)iVar6;
  }
  if ((lVar9 < lVar7) && (pSVar10 = (this->symbols).d.ptr, pSVar10[lVar9].token == STRING)) {
    this->index = iVar6 + 1;
    Symbol::lexem(&local_38,pSVar10 + (long)(iVar6 + 1) + -1);
    pQVar1 = &((importRule->href).d.d)->super_QArrayData;
    pcVar2 = (importRule->href).d.ptr;
    (importRule->href).d.d = local_38.d.d;
    (importRule->href).d.ptr = local_38.d.ptr;
    qVar3 = (importRule->href).d.size;
    (importRule->href).d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
LAB_005e1fc0:
    cVar5 = QString::startsWith((QChar)(char16_t)importRule,0x27);
    if ((cVar5 != '\0') ||
       (cVar5 = QString::startsWith((QChar)(char16_t)importRule,0x22), cVar5 != '\0')) {
      QString::remove((longlong)importRule,0);
      QString::chop((longlong)importRule);
    }
    lVar7 = (this->symbols).d.size;
    iVar6 = this->index;
    lVar9 = (long)iVar6;
    if (lVar9 < lVar7) {
      pSVar10 = (this->symbols).d.ptr;
      if (pSVar10[lVar9].token == S) {
        pSVar10 = pSVar10 + lVar9;
        lVar12 = -1;
        do {
          lVar13 = lVar12;
          pSVar10 = pSVar10 + 1;
          if (lVar9 - lVar7 == lVar13) break;
          lVar12 = lVar13 + -1;
        } while (pSVar10->token == S);
        this->index = iVar6 - (int)lVar13;
        iVar6 = iVar6 - (int)lVar13;
      }
      lVar9 = (long)iVar6;
    }
    if ((lVar9 < lVar7) && ((this->symbols).d.ptr[lVar9].token == IDENT)) {
      this->index = iVar6 + 1;
      while( true ) {
        parseMedium(this,&importRule->media);
        iVar6 = this->index;
        lVar9 = (long)iVar6;
        lVar7 = (this->symbols).d.size;
        if (lVar7 <= lVar9) break;
        pSVar10 = (this->symbols).d.ptr;
        if (pSVar10[lVar9].token != COMMA) {
          lVar9 = (long)iVar6;
          break;
        }
        iVar8 = iVar6 + 1;
        this->index = iVar8;
        lVar9 = (long)iVar8;
        if (lVar9 < lVar7) {
          if (pSVar10[lVar9].token == S) {
            pSVar11 = pSVar10 + lVar9;
            lVar12 = 0;
            do {
              lVar13 = lVar12;
              pSVar11 = pSVar11 + 1;
              if ((lVar9 - lVar7) + 1 == lVar13) break;
              lVar12 = lVar13 + -1;
            } while (pSVar11->token == S);
            iVar8 = (iVar6 - (int)lVar13) + 2;
            this->index = iVar8;
          }
          lVar9 = (long)iVar8;
        }
        if ((lVar7 <= lVar9) || (pSVar10[lVar9].token != IDENT)) goto LAB_005e2152;
        this->index = iVar8 + 1;
      }
    }
    iVar8 = iVar6;
    if (lVar9 < lVar7) {
      iVar8 = iVar6 + 1;
      this->index = iVar8;
      pSVar10 = (this->symbols).d.ptr;
      if (pSVar10[lVar9].token == SEMICOLON) {
        lVar12 = (long)iVar8;
        bVar4 = true;
        lVar9 = lVar7 - lVar12;
        if (lVar9 != 0 && lVar12 <= lVar7) {
          iVar6 = iVar6 + 2;
          pSVar10 = pSVar10 + lVar12;
          do {
            if (pSVar10->token != S) break;
            this->index = iVar6;
            iVar6 = iVar6 + 1;
            pSVar10 = pSVar10 + 1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        goto LAB_005e2157;
      }
    }
LAB_005e2152:
    this->errorIndex = iVar8;
  }
  else {
    bVar4 = testAndParseUri(this,&importRule->href);
    if (bVar4) goto LAB_005e1fc0;
  }
  bVar4 = false;
LAB_005e2157:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Parser::parseImport(ImportRule *importRule)
{
    skipSpace();

    if (test(STRING)) {
        importRule->href = lexem();
    } else {
        if (!testAndParseUri(&importRule->href)) return false;
    }
    removeOptionalQuotes(&importRule->href);

    skipSpace();

    if (testMedium()) {
        if (!parseMedium(&importRule->media)) return false;

        while (test(COMMA)) {
            skipSpace();
            if (!parseNextMedium(&importRule->media)) return false;
        }
    }

    if (!next(SEMICOLON)) return false;

    skipSpace();
    return true;
}